

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * google::protobuf::strings::Utf8SafeCEscape(string *__return_storage_ptr__,string *src)

{
  int src_len;
  int iVar1;
  int iVar2;
  char *dest;
  LogMessage *other;
  LogMessage local_70;
  LogFinisher local_31;
  
  src_len = (int)src->_M_string_length;
  iVar2 = src_len * 4 + 1;
  iVar1 = -1;
  if (-1 < src_len * 4) {
    iVar1 = iVar2;
  }
  dest = (char *)operator_new__((long)iVar1);
  iVar2 = CEscapeInternal((src->_M_dataplus)._M_p,src_len,dest,iVar2,false,true);
  if (iVar2 < 0) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/strutil.cc"
               ,0x264);
    other = internal::LogMessage::operator<<(&local_70,"CHECK failed: (len) >= (0): ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_70);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,dest,dest + iVar2);
  operator_delete__(dest);
  return __return_storage_ptr__;
}

Assistant:

string Utf8SafeCEscape(const string& src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  std::unique_ptr<char[]> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, false, true);
  GOOGLE_DCHECK_GE(len, 0);
  return string(dest.get(), len);
}